

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::Dump
          (DictionaryTypeHandlerBase<unsigned_short> *this,uint indent)

{
  anon_class_24_1_3fcf6586 fn;
  uint indent_00;
  undefined4 in_register_00000034;
  char16_t *local_28;
  char16_t *padding;
  uint mapLabelIndent;
  uint mapValueIndent;
  
  local_28 = L"";
  indent_00 = indent + 2;
  padding._0_4_ = indent + 4;
  padding._4_4_ = indent + 6;
  Output::Print(L"%*sDictionaryTypeHandlerBase (0x%p):\n",CONCAT44(in_register_00000034,indent),L"",
                this);
  DynamicTypeHandler::Dump(&this->super_DynamicTypeHandler,indent_00);
  if ((this->propertyMap).ptr ==
      (BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    Output::Print(L"%*spropertyMap: <null>\n",(ulong)indent_00,L"");
  }
  else {
    Output::Print(L"%*spropertyMap: 0x%p\n",(ulong)indent_00,L"");
    fn.fn.fn.padding = &local_28;
    fn.fn.fn.mapLabelIndent = (uint *)&padding;
    fn.fn.fn.mapValueIndent = (uint *)((long)&padding + 4);
    JsUtil::
    BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    MapEntryUntil<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Common_DataStructures_BaseDictionary_h:587:34)>
              ((this->propertyMap).ptr,fn);
  }
  Output::Print(L"%*snextPropertyIndex: %d\n",(ulong)indent_00,L"",(ulong)this->nextPropertyIndex);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::Dump(unsigned indent) const {
        const auto padding(_u(""));
        const unsigned fieldIndent(indent + 2);
        const unsigned mapLabelIndent(indent + 4);
        const unsigned mapValueIndent(indent + 6);

        Output::Print(_u("%*sDictionaryTypeHandlerBase (0x%p):\n"), indent, padding, this);
        DynamicTypeHandler::Dump(indent + 2);
        if (this->propertyMap == nullptr)
        {
            Output::Print(_u("%*spropertyMap: <null>\n"), fieldIndent, padding);
        }
        else
        {
            Output::Print(_u("%*spropertyMap: 0x%p\n"), fieldIndent, padding, static_cast<void*>(this->propertyMap));
            this->propertyMap->Map([&](const PropertyRecord *key, const DictionaryPropertyDescriptor<T> &value)
            {
                Output::Print(_u("%*sKey:\n"), mapLabelIndent, padding);
                if (key == nullptr)
                {
                    Output::Print(_u("%*s<null>\n"), mapValueIndent, padding);
                }
                else
                {
                    key->Dump(mapValueIndent);
                }
                Output::Print(_u("%*sValue\n"), mapLabelIndent, padding);
                value.Dump(mapValueIndent);
            });
        }
        Output::Print(_u("%*snextPropertyIndex: %d\n"), fieldIndent, padding, static_cast<int32>(this->nextPropertyIndex));
    }